

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O1

function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *
chaiscript::detail::
Cast_Helper<const_std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_&>::cast
          (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,Boxed_Value *ob,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *__x;
  Type_Conversions_State *in_RCX;
  Type_Info local_30;
  
  local_30.m_type_info =
       (type_info *)&std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  local_30.m_bare_type_info = (type_info *)&dispatch::Proxy_Function_Base::typeinfo;
  local_30.m_flags = 1;
  bVar1 = Type_Info::bare_equal
                    (&((ob->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,&local_30);
  if (bVar1) {
    dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>
              (__return_storage_ptr__,(dispatch *)ob,(Boxed_Value *)t_conversions,in_RCX);
  }
  else {
    __x = (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)
          verify_type<void>(ob,(type_info *)
                               &std::
                                function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>::
                                typeinfo,
                            ((ob->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_const_data_ptr);
    std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::function
              (__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::function<Signature> cast(const Boxed_Value &ob, const Type_Conversions_State *t_conversions) {
        if (ob.get_type_info().bare_equal(user_type<Const_Proxy_Function>())) {
          return dispatch::functor<Signature>(ob, t_conversions);
        } else {
          return Cast_Helper_Inner<const std::function<Signature> &>::cast(ob, t_conversions);
        }
      }